

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O2

size_t duckdb::Linenoise::ComputeRenderWidth(char *buf,size_t len)

{
  int32_t iVar1;
  size_t sVar2;
  size_t pos;
  size_t sVar3;
  int sz;
  int local_34;
  
  sVar3 = 0;
  pos = 0;
  while (pos < len) {
    iVar1 = Utf8Proc::UTF8ToCodepoint(buf + pos,&local_34);
    if (iVar1 < 0) {
      pos = pos + 1;
      sVar3 = sVar3 + 1;
    }
    else {
      sVar2 = Utf8Proc::RenderWidth(buf,len,pos);
      pos = Utf8Proc::NextGraphemeCluster(buf,len,pos);
      sVar3 = sVar3 + sVar2;
    }
  }
  return sVar3;
}

Assistant:

size_t Linenoise::ComputeRenderWidth(const char *buf, size_t len) {
	// utf8 in prompt, get render width
	size_t cpos = 0;
	size_t render_width = 0;
	int sz;
	while (cpos < len) {
		if (duckdb::Utf8Proc::UTF8ToCodepoint(buf + cpos, sz) < 0) {
			cpos++;
			render_width++;
			continue;
		}

		size_t char_render_width = duckdb::Utf8Proc::RenderWidth(buf, len, cpos);
		cpos = duckdb::Utf8Proc::NextGraphemeCluster(buf, len, cpos);
		render_width += char_render_width;
	}
	return render_width;
}